

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

bool __thiscall cmake::Open(cmake *this,string *dir,bool dryRun)

{
  cmState *pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  string *psVar5;
  cmGlobalGenerator *pcVar6;
  ostream *poVar7;
  undefined1 uVar8;
  string fullName;
  string cachePath;
  allocator<char> local_aa;
  allocator<char> local_a9;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"",(allocator<char> *)&local_a8);
  SetHomeDirectory(this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"",(allocator<char> *)&local_a8);
  SetHomeOutputDirectory(this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  bVar2 = cmsys::SystemTools::FileIsDirectory(dir);
  if (!bVar2) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error: ");
    poVar7 = std::operator<<(poVar7,(string *)dir);
    std::operator<<(poVar7," is not a directory\n");
    return false;
  }
  FindCacheFile(&local_68,dir);
  bVar2 = LoadCache(this,&local_68);
  if (bVar2) {
    pcVar1 = this->State;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"CMAKE_GENERATOR",(allocator<char> *)&local_88);
    pcVar4 = cmState::GetCacheEntryValue(pcVar1,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    if (pcVar4 != (char *)0x0) {
      pcVar1 = this->State;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"CMAKE_EXTRA_GENERATOR",(allocator<char> *)&local_88);
      psVar5 = cmState::GetInitializedCacheValue(pcVar1,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,pcVar4,&local_a9);
      if (psVar5 == (string *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_aa);
      }
      else {
        std::__cxx11::string::string((string *)&local_48,(string *)psVar5);
      }
      cmExternalMakefileProjectGenerator::CreateFullGeneratorName(&local_a8,&local_88,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_88);
      pcVar6 = CreateGlobalGenerator(this,&local_a8);
      if (pcVar6 == (cmGlobalGenerator *)0x0) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"Error: could create CMAKE_GENERATOR \"");
        poVar7 = std::operator<<(poVar7,(string *)&local_a8);
        std::operator<<(poVar7,"\"\n");
        uVar8 = 0;
      }
      else {
        pcVar1 = this->State;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,"CMAKE_PROJECT_NAME",(allocator<char> *)&local_48);
        pcVar4 = cmState::GetCacheEntryValue(pcVar1,&local_88);
        std::__cxx11::string::~string((string *)&local_88);
        if (pcVar4 == (char *)0x0) {
          std::operator<<((ostream *)&std::cerr,
                          "Error: could not find CMAKE_PROJECT_NAME in Cache\n");
          uVar8 = 0;
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_88,pcVar4,(allocator<char> *)&local_48);
          iVar3 = (*pcVar6->_vptr_cmGlobalGenerator[0x10])(pcVar6,dir,&local_88,(ulong)dryRun);
          uVar8 = (undefined1)iVar3;
          std::__cxx11::string::~string((string *)&local_88);
        }
        (*pcVar6->_vptr_cmGlobalGenerator[1])(pcVar6);
      }
      std::__cxx11::string::~string((string *)&local_a8);
      goto LAB_0019f151;
    }
    std::operator<<((ostream *)&std::cerr,"Error: could not find CMAKE_GENERATOR in Cache\n");
  }
  else {
    std::operator<<((ostream *)&std::cerr,"Error: could not load cache\n");
  }
  uVar8 = 0;
LAB_0019f151:
  std::__cxx11::string::~string((string *)&local_68);
  return (bool)uVar8;
}

Assistant:

bool cmake::Open(const std::string& dir, bool dryRun)
{
  this->SetHomeDirectory("");
  this->SetHomeOutputDirectory("");
  if (!cmSystemTools::FileIsDirectory(dir)) {
    std::cerr << "Error: " << dir << " is not a directory\n";
    return false;
  }

  std::string cachePath = FindCacheFile(dir);
  if (!this->LoadCache(cachePath)) {
    std::cerr << "Error: could not load cache\n";
    return false;
  }
  const char* genName = this->State->GetCacheEntryValue("CMAKE_GENERATOR");
  if (!genName) {
    std::cerr << "Error: could not find CMAKE_GENERATOR in Cache\n";
    return false;
  }
  const std::string* extraGenName =
    this->State->GetInitializedCacheValue("CMAKE_EXTRA_GENERATOR");
  std::string fullName =
    cmExternalMakefileProjectGenerator::CreateFullGeneratorName(
      genName, extraGenName ? *extraGenName : "");

  std::unique_ptr<cmGlobalGenerator> gen(
    this->CreateGlobalGenerator(fullName));
  if (!gen) {
    std::cerr << "Error: could create CMAKE_GENERATOR \"" << fullName
              << "\"\n";
    return false;
  }

  const char* cachedProjectName =
    this->State->GetCacheEntryValue("CMAKE_PROJECT_NAME");
  if (!cachedProjectName) {
    std::cerr << "Error: could not find CMAKE_PROJECT_NAME in Cache\n";
    return false;
  }

  return gen->Open(dir, cachedProjectName, dryRun);
}